

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLDocument::~XMLDocument(XMLDocument *this)

{
  (this->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_001b06a0;
  Clear(this);
  MemPoolT<104>::~MemPoolT(&this->_commentPool);
  MemPoolT<112>::~MemPoolT(&this->_textPool);
  MemPoolT<80>::~MemPoolT(&this->_attributePool);
  MemPoolT<120>::~MemPoolT(&this->_elementPool);
  DynArray<tinyxml2::XMLNode_*,_10>::~DynArray(&this->_unlinked);
  StrPair::Reset(&this->_errorStr);
  XMLComment::~XMLComment((XMLComment *)this);
  return;
}

Assistant:

XMLDocument::~XMLDocument()
{
    Clear();
}